

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

bool __thiscall QFileDevice::flush(QFileDevice *this)

{
  QRingBufferRef *this_00;
  QIODevicePrivate *pQVar1;
  QRingBuffer *pQVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  FileError FVar6;
  void *pvVar7;
  char *pcVar8;
  void *__ptr;
  FileError FVar9;
  QAbstractFileEngine *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  this_01 = (QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate;
  if (this_01 != (QAbstractFileEngine *)0x0) {
    pQVar2 = (pQVar1->writeBuffer).m_buf;
    if ((pQVar2 == (QRingBuffer *)0x0) || (pQVar2->bufferSize == 0)) {
LAB_0010be1a:
      iVar5 = (*this_01->_vptr_QAbstractFileEngine[4])();
      bVar4 = true;
      if ((char)iVar5 != '\0') goto LAB_0010be71;
      this_01 = (QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate;
    }
    else {
      this_00 = &pQVar1->writeBuffer;
      pvVar7 = (void *)QIODevicePrivate::QRingBufferRef::nextDataBlockSize(this_00);
      pp_Var3 = pQVar1[1]._vptr_QIODevicePrivate;
      pcVar8 = QIODevicePrivate::QRingBufferRef::readPointer(this_00);
      __ptr = (void *)(**(code **)(*pp_Var3 + 0x128))(pp_Var3,pcVar8,pvVar7);
      if (0 < (long)__ptr) {
        QIODevicePrivate::QRingBufferRef::free(this_00,__ptr);
      }
      this_01 = (QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate;
      if (__ptr == pvVar7) goto LAB_0010be1a;
    }
    FVar6 = QAbstractFileEngine::error(this_01);
    FVar9 = WriteError;
    if (FVar6 != UnspecifiedError) {
      FVar9 = FVar6;
    }
    QAbstractFileEngine::errorString
              ((QString *)&QStack_48,(QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
    *(FileError *)((long)&pQVar1[1].devicePos + 4) = FVar9;
    QString::operator=(&pQVar1->errorString,(QString *)&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  }
  bVar4 = false;
LAB_0010be71:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::flush()
{
    Q_D(QFileDevice);
    if (!d->fileEngine) {
        qWarning("QFileDevice::flush: No file engine. Is IODevice open?");
        return false;
    }

    if (!d->writeBuffer.isEmpty()) {
        qint64 size = d->writeBuffer.nextDataBlockSize();
        qint64 written = d->fileEngine->write(d->writeBuffer.readPointer(), size);
        if (written > 0)
            d->writeBuffer.free(written);
        if (written != size) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
            return false;
        }
    }

    if (!d->fileEngine->flush()) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::WriteError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    return true;
}